

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiColMod *__dest;
  ImGuiContext *pIVar9;
  int iVar10;
  ImGuiColMod *pIVar11;
  int iVar12;
  ImVec4 *pIVar13;
  
  pIVar7 = GImGui;
  pIVar13 = (GImGui->Style).Colors + idx;
  fVar3 = pIVar13->x;
  fVar4 = pIVar13->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar5 = pIVar1->z;
  fVar6 = pIVar1->w;
  iVar8 = (GImGui->ColorModifiers).Size;
  if (iVar8 != (GImGui->ColorModifiers).Capacity) {
    __dest = (GImGui->ColorModifiers).Data;
    goto LAB_00139e53;
  }
  if (iVar8 == 0) {
    iVar10 = 8;
  }
  else {
    iVar10 = iVar8 / 2 + iVar8;
  }
  iVar12 = iVar8 + 1;
  if (iVar8 + 1 < iVar10) {
    iVar12 = iVar10;
  }
  piVar2 = &(GImGui->IO).MetricsAllocs;
  *piVar2 = *piVar2 + 1;
  __dest = (ImGuiColMod *)(*(pIVar7->IO).MemAllocFn)((long)iVar12 * 0x14);
  pIVar11 = (pIVar7->ColorModifiers).Data;
  if (pIVar11 == (ImGuiColMod *)0x0) {
LAB_00139e33:
    pIVar11 = (ImGuiColMod *)0x0;
    pIVar9 = GImGui;
  }
  else {
    memcpy(__dest,pIVar11,(long)(pIVar7->ColorModifiers).Size * 0x14);
    pIVar9 = GImGui;
    pIVar11 = (pIVar7->ColorModifiers).Data;
    if (pIVar11 == (ImGuiColMod *)0x0) goto LAB_00139e33;
    piVar2 = &(GImGui->IO).MetricsAllocs;
    *piVar2 = *piVar2 + -1;
  }
  (*(pIVar9->IO).MemFreeFn)(pIVar11);
  (pIVar7->ColorModifiers).Data = __dest;
  (pIVar7->ColorModifiers).Capacity = iVar12;
  iVar8 = (pIVar7->ColorModifiers).Size;
LAB_00139e53:
  (pIVar7->ColorModifiers).Size = iVar8 + 1;
  __dest[iVar8].Col = idx;
  pIVar1 = &__dest[iVar8].BackupValue;
  pIVar1->x = fVar3;
  pIVar1->y = fVar4;
  pIVar1->z = fVar5;
  pIVar1->w = fVar6;
  fVar3 = col->y;
  fVar4 = col->z;
  fVar5 = col->w;
  pIVar13->x = col->x;
  pIVar13->y = fVar3;
  pIVar1 = (pIVar7->Style).Colors + idx;
  pIVar1->z = fVar4;
  pIVar1->w = fVar5;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = col;
}